

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_fullgc(lua_State *L,int isemergency)

{
  lu_byte lVar1;
  global_State *g_00;
  int origkind;
  global_State *g;
  int isemergency_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  lVar1 = g_00->gckind;
  if (isemergency == 0) {
    g_00->gckind = '\0';
    callallpendingfinalizers(L,1);
  }
  else {
    g_00->gckind = '\x01';
  }
  if ((g_00->gckind == '\x02') || (g_00->gcstate < 2)) {
    entersweep(L);
  }
  luaC_runtilstate(L,0x20);
  luaC_runtilstate(L,-0x21);
  luaC_runtilstate(L,0x20);
  if (lVar1 == '\x02') {
    luaC_runtilstate(L,1);
  }
  g_00->gckind = lVar1;
  setpause(g_00,g_00->totalbytes + g_00->GCdebt);
  if (isemergency == 0) {
    callallpendingfinalizers(L,1);
  }
  return;
}

Assistant:

void luaC_fullgc (lua_State *L, int isemergency) {
  global_State *g = G(L);
  int origkind = g->gckind;
  lua_assert(origkind != KGC_EMERGENCY);
  if (isemergency)  /* do not run finalizers during emergency GC */
    g->gckind = KGC_EMERGENCY;
  else {
    g->gckind = KGC_NORMAL;
    callallpendingfinalizers(L, 1);
  }
  if (keepinvariant(g)) {  /* may there be some black objects? */
    /* must sweep all objects to turn them back to white
       (as white has not changed, nothing will be collected) */
    entersweep(L);
  }
  /* finish any pending sweep phase to start a new cycle */
  luaC_runtilstate(L, bitmask(GCSpause));
  luaC_runtilstate(L, ~bitmask(GCSpause));  /* start new collection */
  luaC_runtilstate(L, bitmask(GCSpause));  /* run entire collection */
  if (origkind == KGC_GEN) {  /* generational mode? */
    /* generational mode must be kept in propagate phase */
    luaC_runtilstate(L, bitmask(GCSpropagate));
  }
  g->gckind = origkind;
  setpause(g, gettotalbytes(g));
  if (!isemergency)   /* do not run finalizers during emergency GC */
    callallpendingfinalizers(L, 1);
}